

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O1

void __thiscall cfd::core::BlockHash::BlockHash(BlockHash *this,string *hex)

{
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  unsigned_long local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38;
  
  this->_vptr_BlockHash = (_func_int **)&PTR__BlockHash_007e3680;
  ByteData::ByteData(&this->data_);
  StringUtil::StringToByte(&local_60,(string *)hex);
  local_38.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_40.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,&local_38,&local_40,
             (allocator_type *)local_98);
  local_48 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  if (local_48 == 0x20) {
    ByteData::ByteData((ByteData *)local_98,&local_78);
    ByteData::operator=(&this->data_,(ByteData *)local_98);
    if ((pointer)local_98._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity - local_98._0_8_);
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_98._0_8_ = "cfdcore_coin.cpp";
  local_98._8_4_ = 0x4f;
  local_88._M_allocated_capacity = 0x52574b;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"BlockHash size Invalid. size={}.",
             &local_48);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = &local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"BlockHash size Invalid.","")
  ;
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_98);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

BlockHash::BlockHash(const std::string& hex) : data_() {
  const std::vector<uint8_t>& data = StringUtil::StringToByte(hex);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  if (reverse_buffer.size() != kByteData256Length) {
    warn(
        CFD_LOG_SOURCE, "BlockHash size Invalid. size={}.",
        reverse_buffer.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "BlockHash size Invalid.");
  }
  data_ = ByteData(reverse_buffer);
}